

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall TPZMatrix<TFad<6,_double>_>::Input(TPZMatrix<TFad<6,_double>_> *this,istream *in)

{
  long lVar1;
  int64_t iVar2;
  istream *stream;
  void *in_RSI;
  TPZBaseMatrix *in_RDI;
  TFad<6,_double> elem;
  int64_t j;
  int64_t i;
  int64_t newCol;
  int64_t newRow;
  size_t in_stack_00000378;
  char *in_stack_00000380;
  TFad<6,_double> *x;
  TFad<6,_double> *in_stack_ffffffffffffff60;
  undefined1 local_70 [64];
  TFad<6,_double> *local_30;
  long local_28;
  long local_20;
  long local_18;
  void *local_10;
  
  local_10 = in_RSI;
  std::operator<<((ostream *)&std::cerr,
                  "virtual void TPZMatrix<TFad<6, double>>::Input(std::istream &) [T = TFad<6, double>]"
                 );
  std::operator<<((ostream *)&std::cerr," not implemented for this type\n");
  std::operator<<((ostream *)&std::cerr,"Aborting...");
  pzinternal::DebugStopImpl(in_stack_00000380,in_stack_00000378);
  std::istream::operator>>(local_10,&local_18);
  std::istream::operator>>(local_10,&local_20);
  (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xe])(in_RDI,local_18,local_20);
  TFad<6,_double>::TFad(in_stack_ffffffffffffff60);
  local_28 = 0;
  while( true ) {
    lVar1 = local_28;
    iVar2 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar2 <= lVar1) break;
    local_30 = (TFad<6,_double> *)0x0;
    while( true ) {
      x = local_30;
      stream = (istream *)TPZBaseMatrix::Cols(in_RDI);
      if ((long)stream <= (long)x) break;
      ::operator>>(stream,x);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x20])(in_RDI,local_28,local_30,local_70);
      local_30 = (TFad<6,_double> *)((long)&(local_30->super_TPZSavable)._vptr_TPZSavable + 1);
    }
    local_28 = local_28 + 1;
  }
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x1313845);
  return;
}

Assistant:

void TPZMatrix<TVar>::Input(std::istream& in )
{
  if constexpr (std::is_same<TVar, TFad<6, REAL>>::value ||
                std::is_same<TVar, Fad<float>>::value ||
                std::is_same<TVar, Fad<double>>::value ||
                std::is_same<TVar, Fad<long double>>::value ||
                std::is_same<TVar, TPZFlopCounter>::value) {
    PZError << __PRETTY_FUNCTION__;
    PZError << " not implemented for this type\n";
    PZError << "Aborting...";
    DebugStop();
  }
    int64_t newRow, newCol;
	in >> newRow;
	in >> newCol;
	Redim( newRow, newCol );
	int64_t i,j;
	TVar elem;
	for(i=0;i<Rows();i++)
		for(j=0;j<Cols();j++)
		{
			in >> elem;
			Put( i,j, elem );
		}
}